

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::analyze_getelementptr_instruction(Impl *impl,GetElementPtrInst *inst)

{
  bool bVar1;
  uint uVar2;
  iterator iVar3;
  Value *pVVar4;
  mapped_type *pmVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  char *__ptr;
  size_t sStack_1070;
  ThreadLocalAllocator<char> local_1059;
  undefined4 uStack_1058;
  undefined3 uStack_1054;
  undefined8 local_1050;
  GlobalVariable *local_1048;
  GetElementPtrInst *inst_local;
  AllocaTrackedIndex tracking;
  
  inst_local = inst;
  tracking.alloca_inst = (AllocaInst *)LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  iVar3 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&tracking);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
      ._M_cur == (__node_type *)0x0) {
LAB_0014b0fb:
    gep_pointer_to_alloca_tracked_inst(&tracking,impl,(Value *)inst);
    if (tracking.alloca_inst != (AllocaInst *)0x0) {
      std::__detail::
      _Insert_base<const_LLVMBC::GetElementPtrInst_*,_const_LLVMBC::GetElementPtrInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<const_LLVMBC::GetElementPtrInst_*,_const_LLVMBC::GetElementPtrInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&impl->masked_alloca_forward_gep,&inst_local);
    }
    bVar1 = true;
  }
  else {
    pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    bVar1 = LLVMBC::isa<LLVMBC::ConstantInt>(pVVar4);
    if (bVar1) {
      uVar2 = LLVMBC::Instruction::getNumOperands(&inst->super_Instruction);
      if (uVar2 == 3) {
        local_1050 = *(undefined8 *)
                      ((long)iVar3.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                             ._M_cur + 0x10);
        local_1048 = *(GlobalVariable **)
                      ((long)iVar3.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                             ._M_cur + 0x20);
        uStack_1054 = (undefined3)
                      ((uint)*(undefined4 *)
                              ((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                     ._M_cur + 0x2c) >> 8);
        uStack_1058 = *(undefined4 *)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                              ._M_cur + 0x29);
        pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&tracking,"dx.nonuniform",&local_1059);
        bVar1 = LLVMBC::Instruction::hasMetadata(&inst->super_Instruction,(String *)&tracking);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&tracking);
        tracking.alloca_inst = (AllocaInst *)inst;
        pmVar5 = std::__detail::
                 _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->llvm_global_variable_to_resource_mapping,
                              (key_type *)&tracking);
        pmVar5->type = (undefined1)local_1050;
        *(undefined3 *)&pmVar5->field_0x1 = local_1050._1_3_;
        pmVar5->meta_index = local_1050._4_4_;
        pmVar5->offset = pVVar4;
        pmVar5->variable = local_1048;
        pmVar5->non_uniform = bVar1;
        *(undefined4 *)&pmVar5->field_0x19 = uStack_1058;
        *(uint *)&pmVar5->field_0x1c = CONCAT31(uStack_1054,uStack_1058._3_1_);
        goto LAB_0014b0fb;
      }
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        __ptr = 
        "[ERROR]: Number of operands to getelementptr for a resource handle is unexpected.\n";
        sStack_1070 = 0x52;
        goto LAB_0014b1d3;
      }
      memcpy(&tracking,"Number of operands to getelementptr for a resource handle is unexpected.\n",
             0x4a);
LAB_0014b187:
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var6)(pvVar7,Error,(char *)&tracking);
    }
    else {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 != (LoggingCallback)0x0) {
        tracking.itr.
        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                   )(_Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                     )0x7265706f20727450;
        tracking.cbv_handle = (Value *)0x6e20736920646e61;
        tracking.alloca_inst = (AllocaInst *)0x6547207473726946;
        tracking.index = (Value *)0x746e656d656c4574;
        goto LAB_0014b187;
      }
      __ptr = "[ERROR]: First GetElementPtr operand is not constant 0.\n";
      sStack_1070 = 0x38;
LAB_0014b1d3:
      fwrite(__ptr,sStack_1070,1,_stderr);
      fflush(_stderr);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool analyze_getelementptr_instruction(Converter::Impl &impl, const llvm::GetElementPtrInst *inst)
{
	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getOperand(0));
	if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
	    !emit_getelementptr_resource(impl, inst, itr->second))
	{
		return false;
	}

	// If this GEP is associated with a tracked alloca, we might want to mask the GEP
	// if this GEP is actually never consumed.
	// Avoids lots of dead code being emitted which looks goofy in disassemblies.
	auto tracking = gep_pointer_to_alloca_tracked_inst(impl, inst);
	if (tracking.alloca_inst)
		impl.masked_alloca_forward_gep.insert(inst);

	return true;
}